

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O2

double Cudd_ReadUsedSlots(DdManager *dd)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)dd->size;
  if (dd->size < 1) {
    uVar3 = uVar2;
  }
  lVar1 = 0;
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    for (uVar4 = 0; dd->subtables[uVar2].slots != uVar4; uVar4 = uVar4 + 1) {
      lVar1 = lVar1 + (ulong)((DdManager *)dd->subtables[uVar2].nodelist[uVar4] != dd);
    }
  }
  uVar2 = 0;
  uVar3 = (ulong)(uint)dd->sizeZ;
  if (dd->sizeZ < 1) {
    uVar3 = uVar2;
  }
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    for (uVar4 = 0; dd->subtableZ[uVar2].slots != uVar4; uVar4 = uVar4 + 1) {
      lVar1 = (lVar1 + 1) - (ulong)(dd->subtableZ[uVar2].nodelist[uVar4] == (DdNode *)0x0);
    }
  }
  for (uVar3 = 0; (dd->constants).slots != uVar3; uVar3 = uVar3 + 1) {
    lVar1 = (lVar1 + 1) - (ulong)((dd->constants).nodelist[uVar3] == (DdNode *)0x0);
  }
  auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar5._0_8_ = lVar1;
  auVar5._12_4_ = 0x45300000;
  return ((auVar5._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / (double)dd->slots;
}

Assistant:

double
Cudd_ReadUsedSlots(
  DdManager * dd)
{
    unsigned long used = 0;
    int i, j;
    int size = dd->size;
    DdNodePtr *nodelist;
    DdSubtable *subtable;
    DdNode *node;
    DdNode *sentinel = &(dd->sentinel);

    /* Scan each BDD/ADD subtable. */
    for (i = 0; i < size; i++) {
        subtable = &(dd->subtables[i]);
        nodelist = subtable->nodelist;
        for (j = 0; (unsigned) j < subtable->slots; j++) {
            node = nodelist[j];
            if (node != sentinel) {
                used++;
            }
        }
    }

    /* Scan the ZDD subtables. */
    size = dd->sizeZ;

    for (i = 0; i < size; i++) {
        subtable = &(dd->subtableZ[i]);
        nodelist = subtable->nodelist;
        for (j = 0; (unsigned) j < subtable->slots; j++) {
            node = nodelist[j];
            if (node != NULL) {
                used++;
            }
        }
    }

    /* Constant table. */
    subtable = &(dd->constants);
    nodelist = subtable->nodelist;
    for (j = 0; (unsigned) j < subtable->slots; j++) {
        node = nodelist[j];
        if (node != NULL) {
            used++;
        }
    }

    return((double)used / (double) dd->slots);

}